

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhostinfo.cpp
# Opt level: O0

void __thiscall QHostInfoLookupManager::abortLookup(QHostInfoLookupManager *this,int id)

{
  long lVar1;
  bool bVar2;
  qsizetype qVar3;
  const_reference ppQVar4;
  QHostInfoRunnable *pQVar5;
  long i_00;
  int in_ESI;
  long in_RDI;
  long in_FS_OFFSET;
  int i_1;
  int i;
  QMutexLocker<QMutex> locker;
  undefined4 in_stack_ffffffffffffff98;
  parameter_type in_stack_ffffffffffffff9c;
  QHostInfoRunnable *in_stack_ffffffffffffffa0;
  qsizetype in_stack_ffffffffffffffa8;
  QList<QHostInfoRunnable_*> *in_stack_ffffffffffffffb0;
  int local_34;
  int local_30;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QMutexLocker<QMutex>::QMutexLocker
            ((QMutexLocker<QMutex> *)in_stack_ffffffffffffffa0,
             (QMutex *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  if (((*(byte *)(in_RDI + 0xe8) & 1) == 0) && (in_ESI != -1)) {
    for (local_30 = 0;
        qVar3 = QList<QHostInfoRunnable_*>::size((QList<QHostInfoRunnable_*> *)(in_RDI + 0x70)),
        local_30 < qVar3; local_30 = local_30 + 1) {
      ppQVar4 = QList<QHostInfoRunnable_*>::at
                          ((QList<QHostInfoRunnable_*> *)in_stack_ffffffffffffffa0,
                           CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
      if ((*ppQVar4)->id == in_ESI) {
        pQVar5 = QList<QHostInfoRunnable_*>::takeAt
                           (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
        if (pQVar5 != (QHostInfoRunnable *)0x0) {
          (**(code **)(*(long *)pQVar5 + 0x10))();
        }
        goto LAB_0021c8b6;
      }
    }
    local_34 = 0;
    while( true ) {
      i_00 = (long)local_34;
      qVar3 = QList<QHostInfoRunnable_*>::size((QList<QHostInfoRunnable_*> *)(in_RDI + 0x88));
      if (qVar3 <= i_00) break;
      ppQVar4 = QList<QHostInfoRunnable_*>::at
                          ((QList<QHostInfoRunnable_*> *)in_stack_ffffffffffffffa0,
                           CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
      if ((*ppQVar4)->id == in_ESI) {
        in_stack_ffffffffffffffa0 =
             QList<QHostInfoRunnable_*>::takeAt(in_stack_ffffffffffffffb0,i_00);
        if (in_stack_ffffffffffffffa0 != (QHostInfoRunnable *)0x0) {
          (**(code **)(*(long *)in_stack_ffffffffffffffa0 + 0x10))();
        }
        goto LAB_0021c8b6;
      }
      local_34 = local_34 + 1;
    }
    bVar2 = QListSpecialMethodsBase<int>::contains<int>
                      ((QListSpecialMethodsBase<int> *)in_stack_ffffffffffffffa0,
                       (int *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
    if (!bVar2) {
      QList<int>::append((QList<int> *)0x21c8ae,in_stack_ffffffffffffff9c);
    }
  }
LAB_0021c8b6:
  QMutexLocker<QMutex>::~QMutexLocker((QMutexLocker<QMutex> *)in_stack_ffffffffffffffa0);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QHostInfoLookupManager::abortLookup(int id)
{
    QMutexLocker locker(&this->mutex);

    if (wasDeleted)
        return;

    if (id == -1)
        return;

#if QT_CONFIG(thread)
    // is postponed? delete and return
    for (int i = 0; i < postponedLookups.size(); i++) {
        if (postponedLookups.at(i)->id == id) {
            delete postponedLookups.takeAt(i);
            return;
        }
    }
#endif

    // is scheduled? delete and return
    for (int i = 0; i < scheduledLookups.size(); i++) {
        if (scheduledLookups.at(i)->id == id) {
            delete scheduledLookups.takeAt(i);
            return;
        }
    }

    if (!abortedLookups.contains(id))
        abortedLookups.append(id);
}